

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root,Value *defaultValue)

{
  bool bVar1;
  const_iterator this_00;
  Value *pVVar2;
  Value *in_RDX;
  Value *in_RDI;
  PathArgument *arg;
  const_iterator __end1;
  const_iterator __begin1;
  Args *__range1;
  Value *node;
  ArrayIndex in_stack_000001a4;
  Value *in_stack_000001a8;
  undefined4 in_stack_ffffffffffffff98;
  ArrayIndex in_stack_ffffffffffffff9c;
  Value *in_stack_ffffffffffffffa0;
  Value *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_38 [2];
  Value *local_28;
  
  local_28 = in_RDX;
  local_38[0]._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin
                 ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)
                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this_00 = std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end
                      ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar1) {
      Value::Value((Value *)this_00._M_current,in_stack_ffffffffffffffb8);
      return in_RDI;
    }
    in_stack_ffffffffffffffb8 =
         (Value *)__gnu_cxx::
                  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  ::operator*(local_38);
    if (*(Kind *)((long)&in_stack_ffffffffffffffb8->limit_ + 4) == kindIndex) {
      bVar1 = Value::isArray((Value *)0x202043);
      if ((!bVar1) ||
         (bVar1 = Value::isValidIndex(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c), !bVar1))
      {
        Value::Value((Value *)this_00._M_current,in_stack_ffffffffffffffb8);
        return in_RDI;
      }
      local_28 = Value::operator[](in_stack_000001a8,in_stack_000001a4);
    }
    else if (*(Kind *)((long)&in_stack_ffffffffffffffb8->limit_ + 4) == kindKey) {
      bVar1 = Value::isObject((Value *)0x2020a1);
      if (!bVar1) {
        Value::Value((Value *)this_00._M_current,in_stack_ffffffffffffffb8);
        return in_RDI;
      }
      in_stack_ffffffffffffffa0 = Value::operator[](in_stack_ffffffffffffffb8,(String *)in_RDI);
      local_28 = in_stack_ffffffffffffffa0;
      pVVar2 = Value::nullSingleton();
      if (in_stack_ffffffffffffffa0 == pVVar2) {
        Value::Value((Value *)this_00._M_current,in_stack_ffffffffffffffb8);
        return in_RDI;
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(local_38);
  } while( true );
}

Assistant:

Value Path::resolve(const Value& root, const Value& defaultValue) const {
  const Value* node = &root;
  for (const auto& arg : args_) {
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_))
        return defaultValue;
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject())
        return defaultValue;
      node = &((*node)[arg.key_]);
      if (node == &Value::nullSingleton())
        return defaultValue;
    }
  }
  return *node;
}